

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O1

void __thiscall
summarycalc::reset_ssl_array(summarycalc *this,int summary_set,int sample_size,OASIS_FLOAT **ssl)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = this->max_summary_id_[summary_set] - this->min_summary_id_[summary_set];
  if (-1 < iVar3 + 1) {
    iVar1 = this->num_idx_;
    uVar2 = 0;
    do {
      if (-1 < iVar1 + sample_size) {
        memset(ssl[uVar2],0,(ulong)(iVar1 + sample_size + 1) << 2);
      }
      uVar2 = uVar2 + 1;
    } while (iVar3 + 2 != uVar2);
  }
  return;
}

Assistant:

void summarycalc::reset_ssl_array(int summary_set, int sample_size, OASIS_FLOAT **ssl)
{
	int maxsummaryids = max_summary_id_[summary_set] - min_summary_id_[summary_set]+1;
	for (int i = 0; i <= maxsummaryids; i++) {
		for (int j = 0; j < sample_size + num_idx_ + 1; j++) {
			ssl[i][j] = 0;
		}
	}
}